

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unpack.c
# Opt level: O2

exr_result_t unpack_half_to_float_3chan_interleave(exr_decode_pipeline_t *decode)

{
  uint uVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  exr_coding_channel_info_t *peVar5;
  void *pvVar6;
  long lVar7;
  long lVar8;
  float *pfVar9;
  float *pfVar10;
  int iVar11;
  void *pvVar12;
  int x;
  ulong uVar13;
  long lVar14;
  ulong uVar15;
  float fVar16;
  
  pvVar6 = decode->unpacked_buffer;
  peVar5 = decode->channels;
  uVar1 = peVar5->width;
  iVar2 = (decode->chunk).height;
  iVar3 = decode->user_line_end_ignore;
  iVar4 = peVar5->user_line_stride;
  pfVar10 = (float *)(peVar5->field_12).decode_to_ptr;
  iVar11 = decode->user_line_begin_skip;
  pvVar12 = (void *)(long)(int)(uVar1 * 6);
  lVar7 = (long)(int)(uVar1 * 6 * iVar11);
  lVar14 = (long)pvVar6 + lVar7;
  uVar15 = 0;
  if (0 < (int)uVar1) {
    uVar15 = (ulong)uVar1;
  }
  lVar8 = lVar7 + (long)(int)uVar1 * 4 + (long)pvVar6;
  lVar7 = lVar7 + (long)(int)uVar1 * 2;
  for (; lVar7 = lVar7 + (long)pvVar6, iVar11 < iVar2 - iVar3; iVar11 = iVar11 + 1) {
    pfVar9 = pfVar10;
    for (uVar13 = 0; uVar15 != uVar13; uVar13 = uVar13 + 1) {
      fVar16 = half_to_float(*(uint16_t *)(lVar14 + uVar13 * 2));
      *pfVar9 = fVar16;
      fVar16 = half_to_float(*(uint16_t *)(lVar7 + uVar13 * 2));
      pfVar9[1] = fVar16;
      fVar16 = half_to_float(*(uint16_t *)(lVar8 + uVar13 * 2));
      pfVar9[2] = fVar16;
      pfVar9 = pfVar9 + 3;
    }
    lVar14 = lVar14 + (long)pvVar12;
    pfVar10 = (float *)((long)pfVar10 + (long)iVar4);
    lVar8 = lVar8 + (long)pvVar12;
    pvVar6 = pvVar12;
  }
  return 0;
}

Assistant:

static exr_result_t
unpack_half_to_float_3chan_interleave (exr_decode_pipeline_t* decode)
{
    /* we know we're unpacking all the channels and there is no subsampling */
    const uint8_t*  srcbuffer = decode->unpacked_buffer;
    const uint16_t *in0, *in1, *in2;
    uint8_t*        out0;
    int             w, h;
    int             linc0;

    w     = decode->channels[0].width;
    h     = decode->chunk.height - decode->user_line_end_ignore;
    linc0 = decode->channels[0].user_line_stride;

    out0 = decode->channels[0].decode_to_ptr;

    /*
     * not actually using y in the loop, so just pre-increment
     * the srcbuffer for any skip
     */
    srcbuffer += decode->user_line_begin_skip * w * 6;

    /* interleaving case, we can do this! */
    for (int y = decode->user_line_begin_skip; y < h; ++y)
    {
        float* out = (float*) out0;

        in0 = (const uint16_t*) srcbuffer;
        in1 = in0 + w;
        in2 = in1 + w;

        srcbuffer += w * 6; // 3 * sizeof(uint16_t), avoid type conversion
        for (int x = 0; x < w; ++x)
        {
            out[0] = half_to_float (one_to_native16 (in0[x]));
            out[1] = half_to_float (one_to_native16 (in1[x]));
            out[2] = half_to_float (one_to_native16 (in2[x]));
            out += 3;
        }
        out0 += linc0;
    }
    return EXR_ERR_SUCCESS;
}